

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

void __thiscall
Centaurus::CATNMachine<wchar_t>::print(CATNMachine<wchar_t> *this,wostream *os,wstring *name)

{
  pointer pCVar1;
  uint from;
  wostream *pwVar2;
  
  pwVar2 = std::operator<<(os,L"digraph ");
  pwVar2 = std::operator<<(pwVar2,(wstring *)name);
  pwVar2 = std::operator<<(pwVar2,L" {");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<(os,L"rankdir=\"LR\";");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<(os,L"graph [ charset=\"UTF-8\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<(os,L"node [ style=\"solid,filled\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<(os,L"edge [ style=\"solid\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  from = 0;
  while( true ) {
    pCVar1 = (this->m_nodes).
             super__Vector_base<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_nodes).
                       super__Vector_base<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x50) <=
        (ulong)from) break;
    CATNNode<wchar_t>::print(pCVar1 + from,os,from);
    from = from + 1;
  }
  pwVar2 = std::operator<<(os,L"}");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  return;
}

Assistant:

void print(std::wostream& os, const std::wstring& name) const
	{
		os << L"digraph " << name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		for (unsigned int i = 0; i < m_nodes.size(); i++)
		{
			m_nodes[i].print(os, i);
		}

		os << L"}" << std::endl;
	}